

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketParser.cpp
# Opt level: O2

void __thiscall
PacketParser::subValues(PacketParser *this,int key,string *value,__ItemValueType value_type)

{
  int iVar1;
  int iVar2;
  ItemInfo *pIVar3;
  UnsupportedOperationException *pUVar4;
  float fVar5;
  allocator local_4d;
  float local_4c;
  string local_48;
  
  if (value_type == IVT_INT) {
    pIVar3 = AList::operator[](&this->data,key);
    pIVar3 = ItemInfo::operator[](pIVar3,"value");
    iVar1 = (pIVar3->m_value).field_3.iValue;
    iVar2 = std::__cxx11::stoi(value,(size_t *)0x0,10);
    pIVar3 = AList::operator[](&this->data,key);
    pIVar3 = ItemInfo::operator[](pIVar3,"value");
    (*(pIVar3->super__Gen)._vptr__Gen[2])(pIVar3);
    (pIVar3->m_value).type = IVT_INT;
    (pIVar3->m_value).field_3.iValue = iVar1 - iVar2;
  }
  else {
    if (value_type != IVT_FLOAT) {
      if (value_type == IVT_STRING) {
        pUVar4 = (UnsupportedOperationException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_48,"Subtraction of strings is unsupported!",&local_4d);
        UnsupportedOperationException::UnsupportedOperationException
                  (pUVar4,&local_48,(char)key,IVT_STRING);
        __cxa_throw(pUVar4,&UnsupportedOperationException::typeinfo,
                    UnsupportedOperationException::~UnsupportedOperationException);
      }
      pUVar4 = (UnsupportedOperationException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_48,"Unsupported substraction on unknown type.",&local_4d);
      UnsupportedOperationException::UnsupportedOperationException
                (pUVar4,&local_48,(char)key,value_type);
      __cxa_throw(pUVar4,&UnsupportedOperationException::typeinfo,
                  UnsupportedOperationException::~UnsupportedOperationException);
    }
    pIVar3 = AList::operator[](&this->data,key);
    pIVar3 = ItemInfo::operator[](pIVar3,"value");
    local_4c = (pIVar3->m_value).field_3.fValue;
    fVar5 = std::__cxx11::stof(value,(size_t *)0x0);
    local_4c = local_4c - fVar5;
    pIVar3 = AList::operator[](&this->data,key);
    pIVar3 = ItemInfo::operator[](pIVar3,"value");
    (*(pIVar3->super__Gen)._vptr__Gen[2])(pIVar3);
    (pIVar3->m_value).type = IVT_FLOAT;
    (pIVar3->m_value).field_3.fValue = local_4c;
  }
  return;
}

Assistant:

void	PacketParser::subValues(const int key, const std::string &value, const __ItemValueType value_type)
{
	if (value_type == IVT_INT)
	{
		int result = data[key]["value"].get_value().iValue - std::stoi(value);
		data[key]["value"] = result;
	}
	else if (value_type == IVT_FLOAT)
	{
		float result = data[key]["value"].get_value().fValue - std::stof(value);
		data[key]["value"] = result;
	}
	else if (value_type == IVT_STRING)
		throw UnsupportedOperationException("Subtraction of strings is unsupported!", key, value_type);
	else
		throw UnsupportedOperationException("Unsupported substraction on unknown type.", key, value_type);
}